

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O2

double __thiscall Quat4f::exp(Quat4f *this,double __x)

{
  double dVar1;
  double dVar2;
  long in_RSI;
  undefined4 uVar3;
  float fVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  
  dVar1 = (double)SQRT(*(float *)(in_RSI + 0xc) * *(float *)(in_RSI + 0xc) +
                       *(float *)(in_RSI + 4) * *(float *)(in_RSI + 4) +
                       *(float *)(in_RSI + 8) * *(float *)(in_RSI + 8));
  if (1e-06 <= dVar1) {
    dVar2 = sin(dVar1);
    fVar4 = (float)(dVar2 / dVar1);
    dVar1 = cos(dVar1);
    uVar3 = SUB84(dVar1,0);
    uVar5 = (undefined4)((ulong)dVar1 >> 0x20);
    uVar6 = CONCAT44(fVar4 * (float)((ulong)*(undefined8 *)(in_RSI + 4) >> 0x20),
                     fVar4 * (float)*(undefined8 *)(in_RSI + 4));
    fVar4 = fVar4 * *(float *)(in_RSI + 0xc);
  }
  else {
    dVar1 = cos(dVar1);
    uVar3 = SUB84(dVar1,0);
    uVar5 = (undefined4)((ulong)dVar1 >> 0x20);
    uVar6 = *(undefined8 *)(in_RSI + 4);
    fVar4 = *(float *)(in_RSI + 0xc);
  }
  this->m_elements[0] = (float)(double)CONCAT44(uVar5,uVar3);
  *(undefined8 *)(this->m_elements + 1) = uVar6;
  this->m_elements[3] = fVar4;
  return (double)CONCAT44(uVar5,(float)(double)CONCAT44(uVar5,uVar3));
}

Assistant:

Quat4f Quat4f::exp() const
{
	float theta =
		sqrt
		(
			m_elements[ 1 ] * m_elements[ 1 ] +
			m_elements[ 2 ] * m_elements[ 2 ] +
			m_elements[ 3 ] * m_elements[ 3 ]
		);

	if( theta < 1e-6 )
	{
		return Quat4f( cos( theta ), m_elements[ 1 ], m_elements[ 2 ], m_elements[ 3 ] );
	}
	else
	{
		float coeff = sin( theta ) / theta;
		return Quat4f( cos( theta ), m_elements[ 1 ] * coeff, m_elements[ 2 ] * coeff, m_elements[ 3 ] * coeff );		
	}
}